

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::BasicAllTargetsLoadNonMS::Run(BasicAllTargetsLoadNonMS *this)

{
  bool bVar1;
  Vector<unsigned_int,_4> local_d8;
  Vector<unsigned_int,_4> local_c8;
  Vector<int,_4> local_b8;
  Vector<int,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<unsigned_int,_4> local_78;
  Vector<unsigned_int,_4> local_68;
  Vector<int,_4> local_58;
  Vector<int,_4> local_48;
  Vector<float,_4> local_38;
  Vector<float,_4> local_28;
  BasicAllTargetsLoadNonMS *local_18;
  BasicAllTargetsLoadNonMS *this_local;
  
  local_18 = this;
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  tcu::Vector<float,_4>::Vector(&local_28,-1.0,10.0,-200.0,3000.0);
  tcu::Vector<float,_4>::Vector(&local_38,-1.0,10.0,-200.0,3000.0);
  bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsLoadNonMS::Read<tcu::Vector<float,4>>
                    ((BasicAllTargetsLoadNonMS *)this,0x8814,&local_28,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    tcu::Vector<int,_4>::Vector(&local_48,-1,10,-200,3000);
    tcu::Vector<int,_4>::Vector(&local_58,-1,10,-200,3000);
    bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsLoadNonMS::Read<tcu::Vector<int,4>>
                      ((BasicAllTargetsLoadNonMS *)this,0x8d82,&local_48,&local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::Vector<unsigned_int,_4>::Vector(&local_68,1,10,200,3000);
      tcu::Vector<unsigned_int,_4>::Vector(&local_78,1,10,200,3000);
      bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsLoadNonMS::
              Read<tcu::Vector<unsigned_int,4>>
                        ((BasicAllTargetsLoadNonMS *)this,0x8d70,&local_68,&local_78);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        tcu::Vector<float,_4>::Vector(&local_88,-1.0,10.0,-200.0,3000.0);
        tcu::Vector<float,_4>::Vector(&local_98,-1.0,10.0,-200.0,3000.0);
        bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsLoadNonMS::
                ReadCube<tcu::Vector<float,4>>
                          ((BasicAllTargetsLoadNonMS *)this,0x8814,&local_88,&local_98);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          tcu::Vector<int,_4>::Vector(&local_a8,-1,10,-200,3000);
          tcu::Vector<int,_4>::Vector(&local_b8,-1,10,-200,3000);
          bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsLoadNonMS::
                  ReadCube<tcu::Vector<int,4>>
                            ((BasicAllTargetsLoadNonMS *)this,0x8d82,&local_a8,&local_b8);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            tcu::Vector<unsigned_int,_4>::Vector(&local_c8,1,10,200,3000);
            tcu::Vector<unsigned_int,_4>::Vector(&local_d8,1,10,200,3000);
            bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsLoadNonMS::
                    ReadCube<tcu::Vector<unsigned_int,4>>
                              ((BasicAllTargetsLoadNonMS *)this,0x8d70,&local_c8,&local_d8);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              this_local = (BasicAllTargetsLoadNonMS *)0x0;
            }
            else {
              this_local = (BasicAllTargetsLoadNonMS *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (BasicAllTargetsLoadNonMS *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicAllTargetsLoadNonMS *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicAllTargetsLoadNonMS *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicAllTargetsLoadNonMS *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicAllTargetsLoadNonMS *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!Read(GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f)))
			return ERROR;
		if (!Read(GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000)))
			return ERROR;
		if (!Read(GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000)))
			return ERROR;

		if (!ReadCube(GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f)))
			return ERROR;
		if (!ReadCube(GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000)))
			return ERROR;
		if (!ReadCube(GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000)))
			return ERROR;

		return NO_ERROR;
	}